

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VkBootstrap.cpp
# Opt level: O0

VkResult vkb::detail::
         get_vector<VkPresentModeKHR,VkResult(*&)(VkPhysicalDevice_T*,VkSurfaceKHR_T*,unsigned_int*,VkPresentModeKHR*),VkPhysicalDevice_T*&,VkSurfaceKHR_T*&>
                   (vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *out,
                   _func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
                   **f,VkPhysicalDevice_T **ts,VkSurfaceKHR_T **ts_1)

{
  VkPhysicalDevice_T *pVVar1;
  VkSurfaceKHR_T *pVVar2;
  VkSurfaceKHR_T *pVVar3;
  VkResult VVar4;
  VkPresentModeKHR *pVVar5;
  uint local_34;
  VkResult err;
  uint32_t count;
  VkSurfaceKHR_T **ts_local_1;
  VkPhysicalDevice_T **ts_local;
  _func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr **f_local;
  vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *out_local;
  
  local_34 = 0;
  _err = ts_1;
  ts_local_1 = (VkSurfaceKHR_T **)ts;
  ts_local = (VkPhysicalDevice_T **)f;
  f_local = (_func_VkResult_VkPhysicalDevice_T_ptr_VkSurfaceKHR_T_ptr_uint_ptr_VkPresentModeKHR_ptr
             **)out;
  do {
    VVar4 = (*(code *)*ts_local)(*ts_local_1,*_err,&local_34,0);
    if (VVar4 != VK_SUCCESS) {
      return VVar4;
    }
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)f_local,
               (ulong)local_34);
    pVVar1 = *ts_local;
    pVVar2 = *ts_local_1;
    pVVar3 = *_err;
    pVVar5 = std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::data
                       ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)f_local);
    VVar4 = (*(code *)pVVar1)(pVVar2,pVVar3,&local_34,pVVar5);
    std::vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_>::resize
              ((vector<VkPresentModeKHR,_std::allocator<VkPresentModeKHR>_> *)f_local,
               (ulong)local_34);
  } while (VVar4 == VK_INCOMPLETE);
  return VVar4;
}

Assistant:

auto get_vector(std::vector<T>& out, F&& f, Ts&&... ts) -> VkResult {
    uint32_t count = 0;
    VkResult err;
    do {
        err = f(ts..., &count, nullptr);
        if (err != VK_SUCCESS) {
            return err;
        };
        out.resize(count);
        err = f(ts..., &count, out.data());
        out.resize(count);
    } while (err == VK_INCOMPLETE);
    return err;
}